

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m256v_copy_submat(m256v *A,int A_row_offs,int A_col_offs,int n_row,int n_col,m256v *At,
                      int At_row_offs,int At_col_offs)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  lVar5 = (long)At_row_offs;
  uVar6 = 0;
  uVar4 = (ulong)(uint)n_col;
  if (n_col < 1) {
    uVar4 = uVar6;
  }
  lVar3 = (long)A_row_offs;
  uVar1 = (ulong)(uint)n_row;
  if (n_row < 1) {
    uVar1 = uVar6;
  }
  for (; uVar2 = uVar4, lVar7 = (long)A_col_offs, lVar8 = (long)At_col_offs, uVar6 != uVar1;
      uVar6 = uVar6 + 1) {
    while (bVar9 = uVar2 != 0, uVar2 = uVar2 - 1, bVar9) {
      At->e[lVar8 + At->rstride * lVar5] = A->e[lVar7 + A->rstride * lVar3];
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 1;
    }
    lVar5 = lVar5 + 1;
    lVar3 = lVar3 + 1;
  }
  return;
}

Assistant:

void MV_GEN_N(_copy_submat)(const MV_GEN_TYPE* A,
				int A_row_offs,
				int A_col_offs,
				int n_row,
				int n_col,
				MV_GEN_TYPE* At,
				int At_row_offs,
				int At_col_offs)
{
	assert(0 <= n_row);
	assert(0 <= n_col);

	assert(0 <= A_row_offs);
	assert(0 <= A_col_offs);
	assert(A_row_offs + n_row <= A->n_row);
	assert(A_col_offs + n_col <= A->n_col);

	assert(0 <= At_row_offs);
	assert(0 <= At_col_offs);
	assert(At_row_offs + n_row <= At->n_row);
	assert(At_col_offs + n_col <= At->n_col);

	for (int r = 0; r < n_row; ++r) {
		for (int c = 0; c < n_col; ++c) {
			MV_GEN_N(_set_el)(At,
			  r + At_row_offs,
			  c + At_col_offs,
			  MV_GEN_N(_get_el)(A, r + A_row_offs, c + A_col_offs));
		}
	}
}